

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRoundedCylinder.cpp
# Opt level: O3

void __thiscall
chrono::geometry::ChRoundedCylinder::ArchiveIN(ChRoundedCylinder *this,ChArchiveIn *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::geometry::ChRoundedCylinder>(marchive);
  ChGeometry::ArchiveIN(&this->super_ChGeometry,marchive);
  local_30 = &this->rad;
  local_38 = "rad";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->hlen;
  local_38 = "hlen";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->radsphere;
  local_38 = "radsphere";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  return;
}

Assistant:

void ChRoundedCylinder::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/marchive.VersionRead<ChRoundedCylinder>();
    // deserialize parent class
    ChGeometry::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(rad);
    marchive >> CHNVP(hlen);
    marchive >> CHNVP(radsphere);
}